

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O3

void __thiscall MetaSim::BaseStat::print(BaseStat *this)

{
  pointer pcVar1;
  ostream *poVar2;
  double dVar3;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pcVar1 = (this->_name)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->_name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]:",2);
  dVar3 = getMean(this);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  (Conf[95%]=",0xd);
  dVar3 = getConfInterval(this,C95);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void BaseStat::print()
    {
        cout << "[" << getName()
             << "]:" << getMean()
             << "  (Conf[95%]=" << getConfInterval(BaseStat::C95)
             << ")" 
             << endl;
    }